

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

bool isPrime(BigInt *n,int k)

{
  pointer plVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  longlong *plVar5;
  int iVar6;
  BigInt d;
  BigInt local_b8;
  BigInt local_98;
  BigInt local_78;
  pair<BigInt,_long_long> local_58;
  
  bVar2 = BigInt::operator<(&one,n);
  if (bVar2) {
    bVar2 = BigInt::operator<(&three,n);
    plVar1 = primes.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    plVar5 = primes.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (!bVar2) {
      return true;
    }
    if ((*(byte *)(n->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start & 1) != 0) {
      bVar2 = primes.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              primes.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if (!bVar2) {
        lVar4 = BigInt::operator%(n,*primes.
                                     super__Vector_base<long_long,_std::allocator<long_long>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        while (lVar4 != 0) {
          plVar5 = plVar5 + 1;
          bVar2 = plVar5 == plVar1;
          if (bVar2) goto LAB_00103c52;
          lVar4 = BigInt::operator%(n,*plVar5);
        }
        if (!bVar2) {
          return false;
        }
      }
LAB_00103c52:
      BigInt::operator-(&local_b8,n,&one);
      if ((*local_b8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start & 1) == 0) {
        do {
          BigInt::Half(&local_58,&local_b8);
          local_b8.sign = local_58.first.sign;
          std::vector<long_long,_std::allocator<long_long>_>::operator=
                    (&local_b8.vector_value,
                     (vector<long_long,_std::allocator<long_long>_> *)&local_58);
          if (local_58.first.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.first.vector_value.
                            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        } while ((*local_b8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start & 1) == 0);
      }
      bVar2 = k < 1;
      if (0 < k) {
        iVar6 = 1;
        do {
          std::vector<long_long,_std::allocator<long_long>_>::vector
                    (&local_78.vector_value,&local_b8.vector_value);
          local_78.sign = local_b8.sign;
          std::vector<long_long,_std::allocator<long_long>_>::vector
                    (&local_98.vector_value,&n->vector_value);
          local_98.sign = n->sign;
          bVar3 = miillerTest(&local_78,&local_98);
          if (local_98.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.vector_value.
                            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_78.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.vector_value.
                            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (!bVar3) break;
          bVar2 = k <= iVar6;
          bVar3 = iVar6 != k;
          iVar6 = iVar6 + 1;
        } while (bVar3);
      }
      if ((byte *)local_b8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_b8.vector_value.
                        super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
        return bVar2;
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool isPrime(const BigInt &n, int k = 64) //! false negative probability 2^-128
{
    //! Corner cases
    if (n <= one) return false; //! one or less
    else if (n <= three) return true; //! 2 or 3
    else if (!(n.vector_value[0] & 1)) return false;//! even and not 2

    for (long long prime : primes)
        if (n % prime == 0) //! is prime
            return false;

    //! Find the odd number d such that d*(2^r) + 1 = n  for some r >= 1
    BigInt d = n - one;
    //!Base cases make sure that n must be odd. Since n is odd, n-1 must be even. And an even number can be written as d * 2^s where d is an odd number and s > 0
    while (!(d.vector_value[0] & 1)) //! if we found any odd number it will be put as d
        d = d.Half().first;

    // !Iterate given n repeat of 'k' times
    for (int i = 0; i < k; i++)
        if (!miillerTest(d, n))
            return false;

    return true;
}